

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall InterCode::InterCode(InterCode *this,int k,Operand *t,Operand *a1,Operand *a2)

{
  Operand *in_RCX;
  Operand *in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  
  *in_RDI = in_ESI;
  Operand::Operand(in_RCX,in_RDX);
  Operand::Operand(in_RCX,in_RDX);
  Operand::Operand(in_RCX,in_RDX);
  return;
}

Assistant:

InterCode(int k, Operand t, Operand a1, Operand a2):
            kind(k), target(move(t)), arg1(move(a1)), arg2(move(a2)) {}